

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O0

Frag __thiscall re2::Compiler::Quest(Compiler *this,Frag a,bool nongreedy)

{
  bool bVar1;
  uint32 begin;
  PatchList end;
  PatchList local_34;
  PatchList pl;
  int id;
  bool nongreedy_local;
  Compiler *this_local;
  Frag a_local;
  
  bVar1 = IsNoMatch(a);
  if (bVar1) {
    a_local = Nop(this);
  }
  else {
    begin = AllocInst(this,1);
    if ((int)begin < 0) {
      a_local = NoMatch(this);
    }
    else {
      this_local._0_4_ = a.begin;
      if (nongreedy) {
        Prog::Inst::InitAlt(this->inst_ + (int)begin,0,(uint32)this_local);
        local_34 = PatchList::Mk(begin << 1);
      }
      else {
        Prog::Inst::InitAlt(this->inst_ + (int)begin,(uint32)this_local,0);
        local_34 = PatchList::Mk(begin << 1 | 1);
      }
      this_local._4_4_ = a.end.p;
      end = PatchList::Append(this->inst_,local_34,this_local._4_4_);
      Frag::Frag(&a_local,begin,end);
    }
  }
  return a_local;
}

Assistant:

Frag Compiler::Quest(Frag a, bool nongreedy) {
  if (IsNoMatch(a))
    return Nop();
  int id = AllocInst(1);
  if (id < 0)
    return NoMatch();
  PatchList pl;
  if (nongreedy) {
    inst_[id].InitAlt(0, a.begin);
    pl = PatchList::Mk(id << 1);
  } else {
    inst_[id].InitAlt(a.begin, 0);
    pl = PatchList::Mk((id << 1) | 1);
  }
  return Frag(id, PatchList::Append(inst_, pl, a.end));
}